

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O3

bool __thiscall doctest::AssertData::StringContains::check(StringContains *this,String *str)

{
  bool *pbVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  
  if ((str->field_0).buf[0x17] < '\0') {
    str = (String *)(str->field_0).data.ptr;
  }
  pbVar1 = &this->isContains;
  if ((this->content).string.field_0.buf[0x17] < '\0') {
    this = (StringContains *)(this->content).string.field_0.data.ptr;
  }
  if (*pbVar1 == true) {
    pcVar3 = strstr((char *)str,(char *)this);
    bVar4 = pcVar3 != (char *)0x0;
  }
  else {
    iVar2 = strcmp((char *)this,(char *)str);
    bVar4 = iVar2 == 0;
  }
  return bVar4;
}

Assistant:

bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }